

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

int AdvisorShape(Situation *s)

{
  UINT8 UVar1;
  UINT8 UVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int local_34;
  
  UVar1 = s->current_pieces[0x11];
  if ((UVar1 == '\0') || (UVar2 = s->current_pieces[0x12], UVar2 == '\0')) {
    iVar9 = 0;
    if (s->current_pieces[0x28] != '\0') {
      iVar9 = RedAdvisorLeakage;
    }
    if (s->current_pieces[0x27] == '\0') {
      iVar9 = 0;
    }
  }
  else if (s->current_pieces[0x10] == 0xb7) {
    iVar9 = 0x14;
  }
  else {
    iVar9 = 0;
    if (s->current_pieces[0x10] == 199) {
      if (UVar1 == 0xb7) {
        bVar5 = UVar2 == 200;
        local_34 = 200;
        if (UVar2 != 0xc6) {
LAB_0010c7a0:
          iVar9 = (uint)bVar5 * 3;
LAB_0010c7a6:
          if (1 < iVar9 - 2U) {
            if (iVar9 != 0) goto LAB_0010ca2a;
            goto LAB_0010c6b6;
          }
          local_34 = (uint)(iVar9 == 2) * 2 + 0xc6;
        }
        iVar9 = 0;
        lVar12 = 0x29;
        do {
          bVar3 = s->current_pieces[lVar12];
          if (bVar3 != 0) {
            uVar6 = bVar3 & 0xf;
            bVar3 = bVar3 >> 4;
            if (uVar6 == 7) {
              if ((*(byte *)((ulong)bVar3 * 0x2000 + 0x328d56 + (ulong)s->bit_col[7] * 8) & 1) != 0)
              {
                iVar11 = CentralThreat[bVar3 ^ 0xf];
                bVar5 = IfProtected(1,local_34,s,0);
                iVar10 = (iVar11 >> 2) + 0x14;
                if (!bVar5) {
                  iVar10 = iVar11 >> 2;
                }
                iVar9 = iVar10 + iVar9;
                lVar7 = 0;
                do {
                  bVar3 = s->current_pieces[lVar7 + 0x17];
                  iVar11 = iVar9;
                  if (((bVar3 != 0) && ((bVar3 & 0xfffffff0) == 0xc0)) &&
                     (iVar11 = iVar9 + 0x50,
                     (*(byte *)((ulong)((bVar3 & 0xf) << 0xc) + 0x322d52 +
                               (ulong)s->bit_row[0xc] * 8) & 0x10) == 0)) {
                    iVar11 = iVar9;
                  }
                  iVar9 = iVar11;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 2);
              }
            }
            else if ((bVar3 == 0xc) &&
                    ((*(byte *)((ulong)(uVar6 << 0xc) + 0x322d52 + (ulong)s->bit_row[0xc] * 8) &
                     0x10) != 0)) {
              iVar9 = iVar9 + RedBottomThreat[uVar6];
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x2b);
      }
      else if (UVar1 == 200) {
        bVar5 = UVar2 == 0xb7;
        if (UVar2 != 0xc6) goto LAB_0010c7a0;
LAB_0010ca2a:
        lVar12 = 0;
        iVar9 = 0;
        do {
          if ((s->current_pieces[lVar12 + 0x29] & 0xf) == 7) {
            bVar3 = s->current_pieces[lVar12 + 0x29] >> 4;
            piVar8 = HollowThreat;
            if (((*(byte *)((ulong)bVar3 * 0x2000 + 0x328d52 + (ulong)s->bit_col[7] * 8) & 1) != 0)
               || (((ROOK_CANNON_CAN_GET_ROW_MASK[(ulong)bVar3 * 2 + 3][s->bit_col[7]].
                     supercannon_capture & 1) != 0 &&
                   (piVar8 = CentralThreat, 0xfd < (byte)(s->current_board[0xb7] - 0x17))))) {
              iVar9 = iVar9 + piVar8[bVar3 ^ 0xf];
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 2);
      }
      else if (UVar1 == 0xc6) {
        if (UVar2 == 200) goto LAB_0010ca2a;
        iVar9 = (uint)(UVar2 == 0xb7) * 2;
        goto LAB_0010c7a6;
      }
    }
  }
LAB_0010c6b6:
  UVar1 = s->current_pieces[0x21];
  if ((UVar1 == '\0') || (UVar2 = s->current_pieces[0x22], UVar2 == '\0')) {
    iVar11 = 0;
    if (s->current_pieces[0x18] != '\0') {
      iVar11 = BlackAdvisorLeakage;
    }
    if (s->current_pieces[0x17] == '\0') {
      iVar11 = 0;
    }
    goto LAB_0010c738;
  }
  if (s->current_pieces[0x20] == 'G') {
    iVar11 = 0x14;
    goto LAB_0010c738;
  }
  iVar11 = 0;
  if (s->current_pieces[0x20] != '7') goto LAB_0010c738;
  if (UVar1 == 'G') {
    bVar5 = UVar2 == '8';
    local_34 = 0x38;
    if (UVar2 != '6') {
LAB_0010c8ec:
      iVar11 = (uint)bVar5 * 3;
      goto LAB_0010c8f2;
    }
LAB_0010c913:
    iVar11 = 0;
    lVar12 = 0x19;
    do {
      bVar3 = s->current_pieces[lVar12];
      if (bVar3 != 0) {
        uVar6 = bVar3 & 0xf;
        bVar3 = bVar3 >> 4;
        if (uVar6 == 7) {
          if ((*(byte *)((ulong)bVar3 * 0x2000 + 0x328d57 + (ulong)s->bit_col[7] * 8) & 2) != 0) {
            iVar10 = CentralThreat[bVar3];
            bVar5 = IfProtected(0,local_34,s,0);
            iVar4 = (iVar10 >> 2) + 0x14;
            if (!bVar5) {
              iVar4 = iVar10 >> 2;
            }
            lVar7 = 0;
            iVar10 = iVar4 + iVar11;
            do {
              bVar3 = s->current_pieces[lVar7 + 0x27];
              iVar11 = iVar10;
              if (((bVar3 != 0) && ((bVar3 & 0xfffffff0) == 0x30)) &&
                 (iVar11 = iVar10 + 0x50,
                 (*(byte *)((ulong)((bVar3 & 0xf) << 0xc) + 0x322d52 + (ulong)s->bit_row[3] * 8) &
                 0x10) == 0)) {
                iVar11 = iVar10;
              }
              lVar7 = lVar7 + 1;
              iVar10 = iVar11;
            } while (lVar7 != 2);
          }
        }
        else if ((bVar3 == 3) &&
                ((*(byte *)((ulong)(uVar6 << 0xc) + 0x322d52 + (ulong)s->bit_row[3] * 8) & 0x10) !=
                 0)) {
          iVar11 = iVar11 + BlackBottomThreat[uVar6];
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x1b);
  }
  else {
    if (UVar1 == '8') {
      bVar5 = UVar2 == 'G';
      if (UVar2 != '6') goto LAB_0010c8ec;
    }
    else {
      if (UVar1 != '6') goto LAB_0010c738;
      if (UVar2 == '8') goto LAB_0010cabf;
      iVar11 = (uint)(UVar2 == 'G') * 2;
LAB_0010c8f2:
      if (iVar11 - 2U < 2) {
        local_34 = (uint)(iVar11 == 2) * 2 + 0x36;
        goto LAB_0010c913;
      }
      if (iVar11 == 0) goto LAB_0010c738;
    }
LAB_0010cabf:
    lVar12 = 0;
    iVar11 = 0;
    do {
      if ((s->current_pieces[lVar12 + 0x19] & 0xf) == 7) {
        bVar3 = s->current_pieces[lVar12 + 0x19] >> 4;
        piVar8 = HollowThreat;
        if (((*(byte *)((ulong)bVar3 * 0x2000 + 0x328d53 + (ulong)s->bit_col[7] * 8) & 2) != 0) ||
           (((ROOK_CANNON_CAN_GET_ROW_MASK[(ulong)bVar3 * 2 + 3][s->bit_col[7]].supercannon_capture
             & 0x200) != 0 && (piVar8 = CentralThreat, 0xfd < (byte)(s->current_board[0x47] - 0x27))
            ))) {
          iVar11 = iVar11 + piVar8[bVar3];
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 2);
  }
LAB_0010c738:
  iVar10 = -(iVar11 - iVar9);
  if (s->current_player == 0) {
    iVar10 = iVar11 - iVar9;
  }
  return iVar10;
}

Assistant:

int AdvisorShape(Situation &s)
{
    int pc_cannon, pc_rook, pos, adv1, adv2, x, y, shape;
    int red_penalty_value, black_penalty_value;
    red_penalty_value = black_penalty_value = 0;

    //红方
    if (s.current_pieces[16 + 1] && s.current_pieces[16 + 2]) //双士健在
    {
        if (s.current_pieces[16] == 0xc7)
        {
            adv1 = s.current_pieces[16 + 1];
            adv2 = s.current_pieces[16 + 2];
            if (adv1 == 0xc6) // 红方一个仕在左侧底线
                shape = ((adv2 == 0xc8) ? SHAPE_CENTER : ((adv2 == 0xb7) ? SHAPE_LEFT : SHAPE_NONE));
            else if (adv1 == 0xc8) // 红方一个仕在右侧底线
                shape = ((adv2 == 0xc6) ? SHAPE_CENTER : ((adv2 == 0xb7) ? SHAPE_RIGHT : SHAPE_NONE));
            else if (adv1 == 0xb7) // 红方一个仕在花心
                shape = ((adv2 == 0xc6) ? SHAPE_LEFT : ((adv2 == 0xc8) ? SHAPE_RIGHT : SHAPE_NONE));
            else
                shape = SHAPE_NONE;

            switch (shape)
            {
            case SHAPE_NONE:
                break;
            case SHAPE_CENTER:
                for (pc_cannon = 32 + 9; pc_cannon <= 32 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        if (x == FILE_CENTER)
                        {
                            y = GetRow(pos);
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].rook_capture & 1) != 0) // 计算空头炮的威胁
                                red_penalty_value += HollowThreat[15 - y];
                            else if (((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 1) != 0) && (s.current_board[0xb7] == 21 || s.current_board[0xb7] == 22)) // 计算炮镇窝心马的威胁
                                red_penalty_value += CentralThreat[15 - y];
                        }
                    }
                }
                break;
            case SHAPE_LEFT:
            case SHAPE_RIGHT:
                for (pc_cannon = 32 + 9; pc_cannon <= 32 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        y = GetRow(pos);
                        if (x == FILE_CENTER)
                        {
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 1) != 0)
                            {
                                // 计算一般中炮的威胁，帅(将)门被对方控制的还有额外罚分
                                red_penalty_value += ((CentralThreat[15 - y] >> 2) +
                                                        (IfProtected(1, shape == SHAPE_LEFT ? 0xc8 : 0xc6, s) ? 20 : 0));
                                // 如果车在底线保护帅(将)，则给予更大的罚分
                                for (pc_rook = 16 + 7; pc_rook <= 16 + 8; pc_rook++)
                                {
                                    pos = s.current_pieces[pc_rook];
                                    if (pos)
                                    {
                                        x = GetCol(pos);
                                        y = GetRow(pos);
                                        if (y == RANK_BOTTOM)
                                        {
                                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                                red_penalty_value += 80;
                                        }
                                    }
                                }
                            }
                        }
                        else if (y == RANK_BOTTOM) // 计算沉底炮的威胁
                        {
                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                red_penalty_value += RedBottomThreat[x];
                        }
                    }
                }
                break;
            default:
                break;
            }
        }
        else if (s.current_pieces[16] == 0xb7) // 有双仕(士)但花心被帅(将)占领，要罚分
            red_penalty_value += 20;
    }
    else
    {
        if (s.current_pieces[32 + 7] && s.current_pieces[32 + 8]) // 缺仕(士)怕双车，有罚分
            red_penalty_value += RedAdvisorLeakage;
    }

    //黑方
    if (s.current_pieces[32 + 1] && s.current_pieces[32 + 2]) //双士健在
    {
        if (s.current_pieces[32] == 0x37)
        {
            adv1 = s.current_pieces[32 + 1];
            adv2 = s.current_pieces[32 + 2];
            if (adv1 == 0x36) // 黑方一个仕在左侧底线
                shape = ((adv2 == 0x38) ? SHAPE_CENTER : ((adv2 == 0x47) ? SHAPE_LEFT : SHAPE_NONE));
            else if (adv1 == 0x38) // 黑方一个仕在右侧底线
                shape = ((adv2 == 0x36) ? SHAPE_CENTER : ((adv2 == 0x47) ? SHAPE_RIGHT : SHAPE_NONE));
            else if (adv1 == 0x47) // 黑方一个仕在花心
                shape = ((adv2 == 0x36) ? SHAPE_LEFT : ((adv2 == 0x38) ? SHAPE_RIGHT : SHAPE_NONE));
            else
                shape = SHAPE_NONE;

            switch (shape)
            {
            case SHAPE_NONE:
                break;
            case SHAPE_CENTER:
                for (pc_cannon = 16 + 9; pc_cannon <= 16 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        if (x == FILE_CENTER)
                        {
                            y = GetRow(pos);
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].rook_capture & 512) != 0) // 计算空头炮的威胁
                                black_penalty_value += HollowThreat[y];
                            else if (((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 512) != 0) && (s.current_board[0x47] == 37 || s.current_board[0x47] == 38)) // 计算炮镇窝心马的威胁
                                black_penalty_value += CentralThreat[y];
                        }
                    }
                }
                break;
            case SHAPE_LEFT:
            case SHAPE_RIGHT:
                for (pc_cannon = 16 + 9; pc_cannon <= 16 + 10; pc_cannon++)
                {
                    pos = s.current_pieces[pc_cannon];
                    if (pos)
                    {
                        x = GetCol(pos);
                        y = GetRow(pos);
                        if (x == FILE_CENTER)
                        {
                            if ((ROOK_CANNON_CAN_GET_COL_MASK[y - 3][s.bit_col[x]].supercannon_capture & 512) != 0)
                            {
                                // 计算一般中炮的威胁，帅(将)门被对方控制的还有额外罚分
                                black_penalty_value += ((CentralThreat[y] >> 2) +
                                                        (IfProtected(0, shape == SHAPE_LEFT ? 0x38 : 0x36, s) ? 20 : 0));
                                // 如果车在底线保护帅(将)，则给予更大的罚分
                                for (pc_rook = 32 + 7; pc_rook <= 32 + 8; pc_rook++)
                                {
                                    pos = s.current_pieces[pc_rook];
                                    if (pos)
                                    {
                                        x = GetCol(pos);
                                        y = GetRow(pos);
                                        if (y == RANK_TOP)
                                        {
                                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                                black_penalty_value += 80;
                                        }
                                    }
                                }
                            }
                        }
                        else if (y == RANK_TOP) // 计算沉底炮的威胁
                        {
                            if ((ROOK_CANNON_CAN_GET_ROW_MASK[x - 3][s.bit_row[y]].rook_capture & 16) != 0)
                                black_penalty_value += BlackBottomThreat[x];
                        }
                    }
                }
                break;
            default:
                break;
            }
        }
        else if (s.current_pieces[32] == 0x47) // 有双仕(士)但花心被帅(将)占领，要罚分
            black_penalty_value += 20;
    }
    else
    {
        if (s.current_pieces[16 + 7] && s.current_pieces[16 + 8]) // 缺仕(士)怕双车，有罚分
            black_penalty_value += BlackAdvisorLeakage;
    }

    return SideValue(s.current_player, black_penalty_value - red_penalty_value);
}